

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

void __thiscall
GlobOpt::TrackIntSpecializedAddSubConstant
          (GlobOpt *this,Instr *instr,AddSubConstantInfo *addSubConstantInfo,Value *dstValue,
          bool updateSourceBounds)

{
  SymID *key;
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  Loop *pLVar1;
  ValueInfo *this_01;
  code *pcVar2;
  InductionVariable *baseValue;
  bool bVar3;
  BOOLEAN BVar4;
  ValueNumber VVar5;
  int32 iVar6;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  StackSym *pSVar9;
  StackSym *pSVar10;
  StackSym *pSVar11;
  Value *pVVar12;
  Instr *pIVar13;
  IntBounds *this_02;
  IntBoundedValueInfo *newValueInfo;
  undefined1 local_68 [8];
  InductionVariable *inductionVariable;
  InductionVariable *local_50;
  InductionVariable *inductionVariable_1;
  ValueInfo *local_40;
  StackSym *local_38;
  
  inductionVariable_1 = (InductionVariable *)dstValue;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c6,"(instr)","instr");
    if (!bVar3) goto LAB_00472f45;
    *puVar7 = 0;
  }
  if (inductionVariable_1 == (InductionVariable *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c7,"(dstValue)","dstValue");
    if (!bVar3) goto LAB_00472f45;
    *puVar7 = 0;
  }
  if (addSubConstantInfo == (AddSubConstantInfo *)0x0) {
    if ((*(uint *)&this->field_0xf4 & 0x40) == 0) {
      return;
    }
    *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
    if (this->prePassLoop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x375,"(IsLoopPrePass())","IsLoopPrePass()");
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
    }
    if (instr->m_opcode != Ld_A) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x376,"(instr->m_opcode == Js::OpCode::Ld_A)",
                         "instr->m_opcode == Js::OpCode::Ld_A");
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
    }
    pIVar13 = instr->m_prev;
    if ((0x33 < (ulong)pIVar13->m_opcode) ||
       ((0x820c000000000U >> ((ulong)pIVar13->m_opcode & 0x3f) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37b,
                         "(instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A)"
                         ,
                         "instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A"
                        );
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
      pIVar13 = instr->m_prev;
    }
    pRVar8 = IR::Opnd::AsRegOpnd(pIVar13->m_dst);
    pSVar11 = pRVar8->m_sym;
    pRVar8 = IR::Opnd::AsRegOpnd(instr->m_src1);
    if (pSVar11 != pRVar8->m_sym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37c,
                         "(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym)"
                         ,
                         "instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym"
                        );
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
    }
    this_00 = &((this->currentBlock->globOptData).inductionVariables)->
               super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    pRVar8 = IR::Opnd::AsRegOpnd(instr->m_dst);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (this_00,&(pRVar8->m_sym->super_Sym).m_id,(InductionVariable **)local_68);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37f,
                         "(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable))"
                         ,
                         "currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable)"
                        );
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
    }
    InductionVariable::SetSymValueNumber
              ((InductionVariable *)local_68,*(ValueNumber *)&inductionVariable_1->sym);
    return;
  }
  if (addSubConstantInfo->srcSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cb,"(addSubConstantInfo->HasInfo())","addSubConstantInfo->HasInfo()");
    if (!bVar3) goto LAB_00472f45;
    *puVar7 = 0;
  }
  if ((this->field_0xf4 & 4) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cc,"(!ignoredIntOverflowForCurrentInstr)",
                       "!ignoredIntOverflowForCurrentInstr");
    if (!bVar3) goto LAB_00472f45;
    *puVar7 = 0;
  }
  if ((this->prePassLoop != (Loop *)0x0) && (bVar3 = DoBoundCheckHoist(this), bVar3)) {
    if ((0x33 < (ulong)instr->m_opcode) ||
       ((0x820c000000000U >> ((ulong)instr->m_opcode & 0x3f) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x2d8,
                         "(instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A)"
                         ,
                         "instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A"
                        );
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
    }
    pRVar8 = IR::Opnd::AsRegOpnd(instr->m_dst);
    pSVar11 = pRVar8->m_sym;
    pSVar9 = AddSubConstantInfo::SrcSym(addSubConstantInfo);
    if (pSVar9 == pSVar11) {
LAB_004728df:
      pVVar12 = AddSubConstantInfo::SrcValue(addSubConstantInfo);
    }
    else {
      pIVar13 = instr->m_prev;
      local_38 = pSVar11;
      if (pIVar13 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_40 = (ValueInfo *)__tls_get_addr(&PTR_013e5f18);
        *(undefined4 *)local_40 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x2e8,"(prevInstr)","prevInstr");
        if (!bVar3) goto LAB_00472f45;
        *(undefined4 *)local_40 = 0;
      }
      if (((pIVar13->m_opcode != Conv_Num) || (bVar3 = IR::Opnd::IsRegOpnd(pIVar13->m_src1), !bVar3)
          ) || (pRVar8 = IR::Opnd::AsRegOpnd(pIVar13->m_src1), pRVar8->m_sym != local_38)) {
LAB_0047282b:
        pIVar13 = instr->m_next;
        if (pIVar13 == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x2f6,"(nextInstr)","nextInstr");
          if (!bVar3) goto LAB_00472f45;
          *puVar7 = 0;
        }
        if (((pIVar13->m_opcode == Ld_A) && (bVar3 = IR::Opnd::IsRegOpnd(pIVar13->m_src1), bVar3))
           && (pRVar8 = IR::Opnd::AsRegOpnd(pIVar13->m_src1), pRVar8->m_sym == local_38)) {
          pSVar11 = AddSubConstantInfo::SrcSym(addSubConstantInfo);
          pRVar8 = IR::Opnd::AsRegOpnd(pIVar13->m_dst);
          if (pRVar8->m_sym == pSVar11) {
            this->field_0xf4 = this->field_0xf4 | 0x40;
            goto LAB_004728df;
          }
        }
        goto LAB_00472d26;
      }
      pRVar8 = IR::Opnd::AsRegOpnd(pIVar13->m_dst);
      pSVar9 = pRVar8->m_sym;
      pSVar10 = AddSubConstantInfo::SrcSym(addSubConstantInfo);
      pSVar11 = local_38;
      if (pSVar9 != pSVar10) goto LAB_0047282b;
      pVVar12 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&local_38->super_Sym);
      if (pVVar12 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        Js::Throw::ReportAssert
                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                   ,0x310,"(value)","value");
        goto LAB_00472f45;
      }
    }
    local_40 = (ValueInfo *)CONCAT44(local_40._4_4_,pVVar12->valueNumber);
    local_38 = (StackSym *)(this->currentBlock->globOptData).inductionVariables;
    if (local_38 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x318,"(inductionVariables)","inductionVariables");
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
    }
    key = &(pSVar11->super_Sym).m_id;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      ((BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        *)local_38,key,&local_50);
    if (bVar3) {
      bVar3 = InductionVariable::IsChangeDeterminate(local_50);
      if (bVar3) {
        VVar5 = InductionVariable::SymValueNumber(local_50);
        if ((ValueNumber)local_40 == VVar5) {
          InductionVariable::SetSymValueNumber(local_50,*(ValueNumber *)&inductionVariable_1->sym);
          if (this->prePassLoop == this->currentBlock->loop) {
            iVar6 = AddSubConstantInfo::Offset(addSubConstantInfo);
            bVar3 = InductionVariable::Add(local_50,iVar6);
            if (!bVar3) goto LAB_00472d1e;
          }
          goto LAB_00472d26;
        }
        InductionVariable::SetChangeIsIndeterminate(local_50);
      }
    }
    else {
      pLVar1 = this->currentBlock->loop;
      if (((this->prePassLoop == pLVar1) &&
          (pVVar12 = GlobOptBlockData::FindValue
                               (&pLVar1->landingPad->globOptData,&pSVar11->super_Sym),
          pVVar12 != (Value *)0x0)) &&
         (((ValueNumber)local_40 == pVVar12->valueNumber &&
          (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                             (this->currentBlock->loop->symsDefInLoop,*key), BVar4 == '\0')))) {
        VVar5 = *(ValueNumber *)&inductionVariable_1->sym;
        iVar6 = AddSubConstantInfo::Offset(addSubConstantInfo);
        InductionVariable::InductionVariable((InductionVariable *)local_68,pSVar11,VVar5,iVar6);
        JsUtil::
        BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add((BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)local_38,(InductionVariable *)local_68);
        goto LAB_00472d26;
      }
    }
LAB_00472d1e:
    this->field_0xf4 = this->field_0xf4 & 0xbf;
  }
LAB_00472d26:
  if (updateSourceBounds && this->prePassLoop == (Loop *)0x0) {
    AddSubConstantInfo::Offset(addSubConstantInfo);
    pVVar12 = AddSubConstantInfo::SrcValue(addSubConstantInfo);
    this_01 = pVVar12->valueInfo;
    bVar3 = ValueType::IsInt(&this_01->super_ValueType);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x355,"(valueInfo->IsInt())","valueInfo->IsInt()");
      if (!bVar3) goto LAB_00472f45;
      *puVar7 = 0;
    }
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    bVar3 = ValueInfo::TryGetIntConstantBounds(this_01,(IntConstantBounds *)local_68,false);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x357,"(valueInfo->TryGetIntConstantBounds(&constantBounds))",
                         "valueInfo->TryGetIntConstantBounds(&constantBounds)");
      if (!bVar3) {
LAB_00472f45:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    baseValue = inductionVariable_1;
    bVar3 = ValueInfo::HasIntConstantValue
                      (*(ValueInfo **)&inductionVariable_1->symValueNumber,false);
    this_02 = GetIntBoundsToUpdate(this,this_01,(IntConstantBounds *)local_68,true,bVar3,true,true);
    if (this_02 != (IntBounds *)0x0) {
      VVar5 = pVVar12->valueNumber;
      local_40 = this_01;
      local_38 = (StackSym *)pVVar12;
      iVar6 = AddSubConstantInfo::Offset(addSubConstantInfo);
      IntBounds::SetLowerBound(this_02,VVar5,(Value *)baseValue,-iVar6,true);
      IntBounds::SetUpperBound(this_02,VVar5,(Value *)baseValue,-iVar6,true);
      newValueInfo = NewIntBoundedValueInfo(this,local_40,this_02);
      ChangeValueInfo(this,(BasicBlock *)0x0,(Value *)local_38,&newValueInfo->super_ValueInfo,false,
                      false);
    }
  }
  return;
}

Assistant:

void GlobOpt::TrackIntSpecializedAddSubConstant(
    IR::Instr *const instr,
    const AddSubConstantInfo *const addSubConstantInfo,
    Value *const dstValue,
    const bool updateSourceBounds)
{
    Assert(instr);
    Assert(dstValue);

    if(addSubConstantInfo)
    {
        Assert(addSubConstantInfo->HasInfo());
        Assert(!ignoredIntOverflowForCurrentInstr);
        do
        {
            if(!IsLoopPrePass() || !DoBoundCheckHoist())
            {
                break;
            }

            Assert(
                instr->m_opcode == Js::OpCode::Incr_A ||
                instr->m_opcode == Js::OpCode::Decr_A ||
                instr->m_opcode == Js::OpCode::Add_A ||
                instr->m_opcode == Js::OpCode::Sub_A);

            StackSym *sym = instr->GetDst()->AsRegOpnd()->m_sym;
            bool isPostfixIncDecPattern = false;
            if(addSubConstantInfo->SrcSym() != sym)
            {
                // Check for the following patterns.
                //
                // This pattern is used for postfix inc/dec operators:
                //     s2 = Conv_Num s1
                //     s1 = Inc s2
                //
                // This pattern is used for prefix inc/dec operators:
                //     s2 = Inc s1
                //     s1 = Ld s2
                IR::Instr *const prevInstr = instr->m_prev;
                Assert(prevInstr);
                if(prevInstr->m_opcode == Js::OpCode::Conv_Num &&
                    prevInstr->GetSrc1()->IsRegOpnd() &&
                    prevInstr->GetSrc1()->AsRegOpnd()->m_sym == sym &&
                    prevInstr->GetDst()->AsRegOpnd()->m_sym == addSubConstantInfo->SrcSym())
                {
                    // s2 will get a new value number, since Conv_Num cannot transfer in the prepass. For the purposes of
                    // induction variable tracking however, it doesn't matter, so record this case and use s1's value in the
                    // current block.
                    isPostfixIncDecPattern = true;
                }
                else
                {
                    IR::Instr *const nextInstr = instr->m_next;
                    Assert(nextInstr);
                    if(nextInstr->m_opcode != Js::OpCode::Ld_A ||
                        !nextInstr->GetSrc1()->IsRegOpnd() ||
                        nextInstr->GetSrc1()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }
                    sym = addSubConstantInfo->SrcSym();
                    if(nextInstr->GetDst()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }

                    // In the prefix inc/dec pattern, the result of Ld currently gets a new value number, which will cause the
                    // induction variable info to become indeterminate. Indicate that the value number should be updated in the
                    // induction variable info.
                    // Consider: Remove this once loop prepass value transfer scheme is fixed
                    updateInductionVariableValueNumber = true;
                }
            }

            // Track induction variable info
            ValueNumber srcValueNumber;
            if(isPostfixIncDecPattern)
            {
                Value *const value = this->currentBlock->globOptData.FindValue(sym);
                Assert(value);
                srcValueNumber = value->GetValueNumber();
            }
            else
            {
                srcValueNumber = addSubConstantInfo->SrcValue()->GetValueNumber();
            }
            InductionVariableSet *const inductionVariables = currentBlock->globOptData.inductionVariables;
            Assert(inductionVariables);
            InductionVariable *inductionVariable;
            if(!inductionVariables->TryGetReference(sym->m_id, &inductionVariable))
            {
                // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated
                // for use by the parent loop, so changes in the current loop have already been tracked.
                if(prePassLoop != currentBlock->loop)
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }

                // Ensure that the sym is live in the landing pad, and that its value has not changed in an unknown way yet
                Value *const landingPadValue = currentBlock->loop->landingPad->globOptData.FindValue(sym);
                if(!landingPadValue || srcValueNumber != landingPadValue->GetValueNumber() || currentBlock->loop->symsDefInLoop->Test(sym->m_id))
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }
                inductionVariables->Add(
                    InductionVariable(sym, dstValue->GetValueNumber(), addSubConstantInfo->Offset()));
                break;
            }

            if(!inductionVariable->IsChangeDeterminate())
            {
                updateInductionVariableValueNumber = false;
                break;
            }

            if(srcValueNumber != inductionVariable->SymValueNumber())
            {
                // The sym's value has changed since the last time induction variable info was recorded for it. Due to the
                // unknown change, mark the info as indeterminate.
                inductionVariable->SetChangeIsIndeterminate();
                updateInductionVariableValueNumber = false;
                break;
            }

            // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated for
            // use by the parent loop, so changes in the current loop have already been tracked. Induction variable value
            // numbers are updated as changes occur, but their change bounds are preserved from the first prepass over the loop.
            inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
            if(prePassLoop != currentBlock->loop)
            {
                break;
            }

            if(!inductionVariable->Add(addSubConstantInfo->Offset()))
            {
                updateInductionVariableValueNumber = false;
            }
        } while(false);

        if(!this->IsLoopPrePass() && updateSourceBounds && addSubConstantInfo->Offset() != IntConstMin)
        {
            // Track bounds for add or sub with a constant. For instance, consider (b = a + 2). The value of 'b' should track
            // that it is equal to (the value of 'a') + 2. That part has been done above. Similarly, the value of 'a' should
            // also track that it is equal to (the value of 'b') - 2.
            Value *const value = addSubConstantInfo->SrcValue();
            const ValueInfo *const valueInfo = value->GetValueInfo();
            Assert(valueInfo->IsInt());
            IntConstantBounds constantBounds;
            AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
            IntBounds *const bounds =
                GetIntBoundsToUpdate(
                    valueInfo,
                    constantBounds,
                    true,
                    dstValue->GetValueInfo()->HasIntConstantValue(),
                    true,
                    true);
            if(bounds)
            {
                const ValueNumber valueNumber = value->GetValueNumber();
                const int32 dstOffset = -addSubConstantInfo->Offset();
                bounds->SetLowerBound(valueNumber, dstValue, dstOffset, true);
                bounds->SetUpperBound(valueNumber, dstValue, dstOffset, true);
                ChangeValueInfo(nullptr, value, NewIntBoundedValueInfo(valueInfo, bounds));
            }
        }
        return;
    }

    if(!updateInductionVariableValueNumber)
    {
        return;
    }

    // See comment above where this is set to true
    // Consider: Remove this once loop prepass value transfer scheme is fixed
    updateInductionVariableValueNumber = false;

    Assert(IsLoopPrePass());
    Assert(instr->m_opcode == Js::OpCode::Ld_A);
    Assert(
        instr->m_prev->m_opcode == Js::OpCode::Incr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Decr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Add_A ||
        instr->m_prev->m_opcode == Js::OpCode::Sub_A);
    Assert(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym);

    InductionVariable *inductionVariable;
    AssertVerify(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable));
    inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
}